

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::FamilyTest_Histogram_Test::~FamilyTest_Histogram_Test
          (FamilyTest_Histogram_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FamilyTest, Histogram) {
  Family<Histogram> family{"request_latency", "Latency Histogram", {}};
  auto& histogram1 = family.Add({{"name", "histogram1"}},
                                Histogram::BucketBoundaries{0, 1, 2});
  histogram1.Observe(0);
  auto collected = family.Collect();
  ASSERT_EQ(collected.size(), 1U);
  ASSERT_GE(collected[0].metric.size(), 1U);
  EXPECT_EQ(1U, collected[0].metric.at(0).histogram.sample_count);
}